

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

Descriptor *
cfd::core::Descriptor::CreateDescriptor
          (Descriptor *__return_storage_ptr__,
          vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *type_list,
          vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
          *key_info_list,uint32_t require_num,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  long lVar1;
  DescriptorScriptType DVar2;
  pointer pDVar3;
  Descriptor *pDVar4;
  long lVar5;
  CfdException *pCVar6;
  _Base_ptr *pp_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *this;
  pointer pDVar9;
  pointer this_00;
  undefined1 local_168 [36];
  uint32_t local_144;
  string output_descriptor;
  string key_text;
  string local_f8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_d8;
  Descriptor *local_d0;
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_> types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_144 = require_num;
  if ((type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (type_list->
      super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    output_descriptor._M_dataplus._M_p = "cfdcore_descriptor.cpp";
    output_descriptor._M_string_length = CONCAT44(output_descriptor._M_string_length._4_4_,0x806);
    output_descriptor.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_af4b1;
    logger::warn<>((CfdSourceLocation *)&output_descriptor,"Failed to type list.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&output_descriptor,"Failed to type list. list is empty.",
               (allocator *)&key_text);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&output_descriptor);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  output_descriptor._M_dataplus._M_p = (pointer)&output_descriptor.field_2;
  output_descriptor._M_string_length = 0;
  output_descriptor.field_2._M_allocated_capacity =
       output_descriptor.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_d8 = network_parameters;
  local_d0 = __return_storage_ptr__;
  ::std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector(&types,type_list);
  pDVar9 = types.
           super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pDVar4 = local_d0;
    if (pDVar9 == types.
                  super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      Parse(local_d0,&output_descriptor,local_d8);
      ::std::
      _Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
      ::~_Vector_base(&types.
                       super__Vector_base<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                     );
      ::std::__cxx11::string::~string((string *)&output_descriptor);
      return pDVar4;
    }
    DVar2 = pDVar9[-1];
    key_text._M_dataplus._M_p = (pointer)&key_text.field_2;
    key_text._M_string_length = 0;
    key_text.field_2._M_local_buf[0] = '\0';
    if (output_descriptor._M_string_length == 0) {
      this_00 = (key_info_list->
                super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (key_info_list->
               super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pDVar3) {
        for (; this_00 != pDVar3; this_00 = this_00 + 1) {
          if (key_text._M_string_length == 0) {
            DescriptorKeyInfo::ToString_abi_cxx11_((string *)local_168,this_00);
            ::std::__cxx11::string::operator=((string *)&key_text,(string *)local_168);
            this = (string *)local_168;
          }
          else {
            DescriptorKeyInfo::ToString_abi_cxx11_(&local_f8,this_00);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_168,",",&local_f8);
            ::std::__cxx11::string::append((string *)&key_text);
            ::std::__cxx11::string::~string((string *)local_168);
            this = &local_f8;
          }
          ::std::__cxx11::string::~string((string *)this);
        }
      }
    }
    pDVar9 = pDVar9 + -1;
    lVar5 = 0x1b8;
    pp_Var7 = &Script::SetStackData::kUseScriptNum3._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
    do {
      if (lVar5 == 0) {
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        break;
      }
      lVar5 = lVar5 + -0x28;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pp_Var7 + 5);
      lVar1 = (long)(pp_Var7 + 9);
      pp_Var7 = (_Base_ptr *)pbVar8;
    } while (DVar2 != *(DescriptorScriptType *)lVar1);
    if (DVar2 - kDescriptorScriptPk < 6) {
      if (output_descriptor._M_string_length != 0) {
        local_168._0_8_ = "cfdcore_descriptor.cpp";
        local_168._8_4_ = 0x82a;
        local_168._16_8_ = "CreateDescriptor";
        logger::warn<>((CfdSourceLocation *)local_168,"key hash type is bottom only.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_168,"Failed to createDescriptor. key hash type is bottom only.",
                   (allocator *)&local_f8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_168);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (key_text._M_string_length == 0) {
        local_168._0_8_ = "cfdcore_descriptor.cpp";
        local_168._8_4_ = 0x830;
        local_168._16_8_ = "CreateDescriptor";
        logger::warn<>((CfdSourceLocation *)local_168,"key list is empty");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_168,"Failed to createDescriptor. key list is empty.",
                   (allocator *)&local_f8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_168);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((*(char *)((long)&pbVar8[1]._M_dataplus._M_p + 6) == '\0') &&
         (1 < (ulong)(((long)(key_info_list->
                             super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(key_info_list->
                            super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x1a0))) {
        local_168._0_8_ = "cfdcore_descriptor.cpp";
        local_168._8_4_ = 0x836;
        local_168._16_8_ = "CreateDescriptor";
        logger::warn<>((CfdSourceLocation *)local_168,"multiple key is multisig only.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_168,"Failed to createDescriptor. multiple key is multisig only.",
                   (allocator *)&local_f8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_168);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
LAB_001bd8e7:
      if (*(char *)((long)&pbVar8[1]._M_dataplus._M_p + 6) != '\x01') {
        ::std::operator+(&local_b0,pbVar8,"(");
        ::std::operator+(&local_f8,&local_b0,&key_text);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168,&local_f8,")");
        goto LAB_001bd9c8;
      }
      ::std::operator+(&local_90,pbVar8,"(");
      ::std::__cxx11::to_string(&local_70,local_144);
      ::std::operator+(&local_50,&local_90,&local_70);
      ::std::operator+(&local_b0,&local_50,",");
      ::std::operator+(&local_f8,&local_b0,&key_text);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&local_f8,")");
      ::std::__cxx11::string::operator=((string *)&output_descriptor,(string *)local_168);
      ::std::__cxx11::string::~string((string *)local_168);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      pbVar8 = &local_90;
    }
    else {
      if (1 < DVar2 - kDescriptorScriptSh) {
        local_168._0_8_ = "cfdcore_descriptor.cpp";
        local_168._8_4_ = 0x849;
        local_168._16_8_ = "CreateDescriptor";
        logger::warn<>((CfdSourceLocation *)local_168,"Failed to script type.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_168,"Failed to script type. this type is unsupported.",
                   (allocator *)&local_f8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_168);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (output_descriptor._M_string_length == 0) {
        local_168._0_8_ = "cfdcore_descriptor.cpp";
        local_168._8_4_ = 0x83f;
        local_168._16_8_ = "CreateDescriptor";
        logger::warn<>((CfdSourceLocation *)local_168,"Failed to script hash type.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_168,
                   "Failed to script hash type. this type is unsupported of key.",
                   (allocator *)&local_f8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_168);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (key_text._M_string_length != 0) goto LAB_001bd8e7;
      ::std::operator+(&local_b0,pbVar8,"(");
      ::std::operator+(&local_f8,&local_b0,&output_descriptor);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&local_f8,")");
LAB_001bd9c8:
      pbVar8 = &local_b0;
      ::std::__cxx11::string::operator=((string *)&output_descriptor,(string *)local_168);
      ::std::__cxx11::string::~string((string *)local_168);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    ::std::__cxx11::string::~string((string *)pbVar8);
    ::std::__cxx11::string::~string((string *)&key_text);
  } while( true );
}

Assistant:

Descriptor Descriptor::CreateDescriptor(
    const std::vector<DescriptorScriptType>& type_list,
    const std::vector<DescriptorKeyInfo>& key_info_list, uint32_t require_num,
    const std::vector<AddressFormatData>* network_parameters) {
  if (type_list.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to type list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to type list. list is empty.");
  }
  std::string output_descriptor;
  std::vector<DescriptorScriptType> types(type_list);
  for (auto ite = types.rbegin(); ite != types.rend(); ++ite) {
    DescriptorScriptType type = *ite;

    std::string key_text;
    if (output_descriptor.empty() && (!key_info_list.empty())) {
      for (const auto& key_info : key_info_list) {
        if (key_text.empty()) {
          key_text = key_info.ToString();
        } else {
          key_text += "," + key_info.ToString();
        }
      }
    }

    const DescriptorNodeScriptData* p_data = nullptr;
    for (const auto& node_data : kDescriptorNodeScriptTable) {
      if (type == node_data.type) {
        p_data = &node_data;
        break;
      }
    }
    switch (type) {
      case DescriptorScriptType::kDescriptorScriptPk:
      case DescriptorScriptType::kDescriptorScriptPkh:
      case DescriptorScriptType::kDescriptorScriptWpkh:
      case DescriptorScriptType::kDescriptorScriptCombo:
      case DescriptorScriptType::kDescriptorScriptMulti:
      case DescriptorScriptType::kDescriptorScriptSortedMulti:
        if (!output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "key hash type is bottom only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key hash type is bottom only.");
        }
        if (key_text.empty()) {
          warn(CFD_LOG_SOURCE, "key list is empty");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. key list is empty.");
        }
        if ((!p_data->multisig) && (key_info_list.size() > 1)) {
          warn(CFD_LOG_SOURCE, "multiple key is multisig only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to createDescriptor. multiple key is multisig only.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptSh:
      case DescriptorScriptType::kDescriptorScriptWsh:
        if (output_descriptor.empty()) {
          warn(CFD_LOG_SOURCE, "Failed to script hash type.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to script hash type. this type is unsupported of key.");
        }
        break;
      case DescriptorScriptType::kDescriptorScriptNull:
      case DescriptorScriptType::kDescriptorScriptAddr:
      case DescriptorScriptType::kDescriptorScriptRaw:
      default:
        warn(CFD_LOG_SOURCE, "Failed to script type.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to script type. this type is unsupported.");
        break;
    }

    if (key_text.empty()) {
      output_descriptor = p_data->name + "(" + output_descriptor + ")";
    } else if (p_data->multisig) {
      output_descriptor = p_data->name + "(" + std::to_string(require_num) +
                          "," + key_text + ")";
    } else {
      output_descriptor = p_data->name + "(" + key_text + ")";
    }
  }

  // Check descriptor script format.
  return Parse(output_descriptor, network_parameters);
}